

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O0

vector<Dog_*,_std::allocator<Dog_*>_> * __thiscall
dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
read<std::vector<Dog*,std::allocator<Dog*>>>
          (vector<Dog_*,_std::allocator<Dog_*>_> *__return_storage_ptr__,
          DukType<std::vector<Dog*,std::allocator<Dog*>>> *this,duk_context *ctx,duk_idx_t arg_idx)

{
  uint uVar1;
  duk_context *ctx_00;
  duk_bool_t dVar2;
  char *pcVar3;
  Dog *local_50;
  ulong local_48;
  duk_size_t i;
  undefined1 local_2d;
  duk_idx_t local_2c;
  duk_size_t dStack_28;
  duk_idx_t elem_idx;
  duk_size_t len;
  duk_int_t type_idx;
  duk_idx_t arg_idx_local;
  duk_context *ctx_local;
  vector<Dog_*,_std::allocator<Dog_*>_> *vec;
  
  len._4_4_ = (uint)ctx;
  _type_idx = (duk_context *)this;
  ctx_local = (duk_context *)__return_storage_ptr__;
  dVar2 = duk_is_array((duk_context *)this,len._4_4_);
  if (dVar2 != 0) {
    dStack_28 = duk_get_length(_type_idx,len._4_4_);
    local_2c = duk_get_top(_type_idx);
    local_2d = 0;
    std::vector<Dog_*,_std::allocator<Dog_*>_>::vector(__return_storage_ptr__);
    std::vector<Dog_*,_std::allocator<Dog_*>_>::reserve(__return_storage_ptr__,dStack_28);
    for (local_48 = 0; local_48 < dStack_28; local_48 = local_48 + 1) {
      duk_get_prop_index(_type_idx,len._4_4_,(duk_uarridx_t)local_48);
      local_50 = DukType<Dog>::read<Dog*,void>(_type_idx,local_2c);
      std::vector<Dog_*,_std::allocator<Dog_*>_>::push_back(__return_storage_ptr__,&local_50);
      duk_pop(_type_idx);
    }
    return __return_storage_ptr__;
  }
  len._0_4_ = duk_get_type(_type_idx,len._4_4_);
  ctx_00 = _type_idx;
  uVar1 = len._4_4_;
  pcVar3 = detail::get_type_name((duk_int_t)len);
  duk_error_raw(ctx_00,6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                ,0x93,"Argument %d: expected array, got %s",(ulong)uVar1,pcVar3);
}

Assistant:

static std::vector<T> read(duk_context* ctx, duk_idx_t arg_idx) {
				if (!duk_is_array(ctx, arg_idx)) {
					duk_int_t type_idx = duk_get_type(ctx, arg_idx);
					duk_error(ctx, DUK_ERR_TYPE_ERROR, "Argument %d: expected array, got %s", arg_idx, detail::get_type_name(type_idx));
				}

				duk_size_t len = duk_get_length(ctx, arg_idx);
				const duk_idx_t elem_idx = duk_get_top(ctx);

				std::vector<T> vec;
				vec.reserve(len);
				for (duk_size_t i = 0; i < len; i++) {
					duk_get_prop_index(ctx, arg_idx, i);
					vec.push_back(DukType< typename Bare<T>::type >::template read<T>(ctx, elem_idx));
					duk_pop(ctx);
				}
				return vec;
			}